

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainWindow.cpp
# Opt level: O3

void __thiscall MainWindow::MainWindow(MainWindow *this)

{
  AudioEnumerator *this_00;
  MidiEnumerator *this_01;
  QSplitter *pQVar1;
  char cVar2;
  Module *this_02;
  TableModel<trackerboy::Instrument> *this_03;
  SongListModel *this_04;
  SongModel *this_05;
  PatternModel *this_06;
  TableModel<trackerboy::Waveform> *this_07;
  Renderer *this_08;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  undefined1 auVar8 [16];
  QByteArray windowState;
  QSettings settings;
  Config config;
  QByteArray local_598;
  undefined1 local_578 [24];
  undefined8 local_560;
  QArrayData *local_558 [2];
  long local_548;
  undefined1 local_540 [32];
  anon_union_24_3_e3d07ef4_for_data local_520 [52];
  
  QMainWindow::QMainWindow(&this->super_QMainWindow,0,0);
  *(undefined ***)this = &PTR_metaObject_001fbac0;
  *(undefined ***)&this->field_0x10 = &PTR__MainWindow_001fbc78;
  this_00 = &this->mAudioEnumerator;
  AudioEnumerator::AudioEnumerator(this_00);
  this_01 = &this->mMidiEnumerator;
  MidiEnumerator::MidiEnumerator(this_01);
  local_540._16_8_ = &this->mUntitledString;
  QMetaObject::tr((char *)local_540._16_8_,(char *)&staticMetaObject,0x1b57f8);
  PianoInput::PianoInput(&this->mPianoInput);
  Palette::Palette(&this->mPalette);
  Midi::Midi(&this->mMidi,(QObject *)0x0);
  this->mModule = (Module *)0x0;
  local_540._24_8_ = &this->mMidi;
  ModuleFile::ModuleFile(&this->mModuleFile);
  this->mErrorSinceLastConfig = false;
  (this->mLastEngineFrame).halted = true;
  *(undefined8 *)&(this->mLastEngineFrame).startedNewRow = 0;
  *(undefined8 *)((long)&(this->mLastEngineFrame).order + 1) = 0;
  *(undefined4 *)((long)&this->mFrameSkip + 1) = 0;
  this->mAutosaveIntervalMs = 30000;
  this->mAutosaveTimer = 0;
  this->mAudioDiag = (AudioDiagDialog *)0x0;
  this->mTempoCalc = (TempoCalculator *)0x0;
  this->mCommentsDialog = (CommentsDialog *)0x0;
  this->mInstrumentEditor = (InstrumentEditor *)0x0;
  this->mWaveEditor = (WaveEditor *)0x0;
  this->mHistoryDialog = (PersistantDialog *)0x0;
  this->mEffectsListDialog = (EffectsListDialog *)0x0;
  this_02 = (Module *)operator_new(0x1a8);
  Module::Module(this_02,(QObject *)this);
  this->mModule = this_02;
  this_03 = (TableModel<trackerboy::Instrument> *)operator_new(0x50);
  TableModel<trackerboy::Instrument>::TableModel(this_03,this_02,(QObject *)this);
  this->mInstrumentModel = this_03;
  this_04 = (SongListModel *)operator_new(0x30);
  SongListModel::SongListModel(this_04,this->mModule,(QObject *)this);
  this->mSongListModel = this_04;
  this_05 = (SongModel *)operator_new(0x20);
  SongModel::SongModel(this_05,this->mModule,(QObject *)this);
  this->mSongModel = this_05;
  this_06 = (PatternModel *)operator_new(0xf0);
  PatternModel::PatternModel(this_06,this->mModule,this_05,(QObject *)this);
  this->mPatternModel = this_06;
  this_07 = (TableModel<trackerboy::Waveform> *)operator_new(0x50);
  TableModel<trackerboy::Waveform>::TableModel(this_07,this->mModule,(QObject *)this);
  this->mWaveModel = this_07;
  this_08 = (Renderer *)operator_new(0x1518);
  Renderer::Renderer(this_08,this->mModule,(QObject *)this);
  this->mRenderer = this_08;
  setupUi(this);
  IconLocator::getAppIcon();
  QWidget::setWindowIcon((QIcon *)this);
  QIcon::~QIcon((QIcon *)local_520[0].data);
  QSettings::QSettings((QSettings *)local_540,(QObject *)0x0);
  QSettings::beginGroup((QString *)local_540);
  local_598.d.d = (Data *)0x0;
  local_598.d.ptr = (char *)0x0;
  local_598.d.size = 0;
  QVariant::QVariant((QVariant *)local_578,&local_598);
  QSettings::value((QString *)local_520,(QVariant *)local_540);
  QVariant::toByteArray();
  cVar2 = QWidget::restoreGeometry((QByteArray *)this);
  if (local_558[0] != (QArrayData *)0x0) {
    LOCK();
    (local_558[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_558[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_558[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_558[0],1,8);
    }
  }
  QVariant::~QVariant((QVariant *)local_520);
  QVariant::~QVariant((QVariant *)local_578);
  if (&(local_598.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_598.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_598.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_598.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_598.d.d)->super_QArrayData,1,8);
    }
  }
  if (cVar2 == '\0') {
    QGuiApplication::primaryScreen();
    auVar8 = QScreen::availableGeometry();
    iVar3 = auVar8._8_4_ - auVar8._0_4_;
    iVar5 = iVar3 * 3 + 3;
    iVar3 = iVar3 * 3 + 6;
    if (-1 < iVar5) {
      iVar3 = iVar5;
    }
    iVar3 = iVar3 >> 2;
    if (0x4ff < iVar3) {
      iVar3 = 0x500;
    }
    iVar5 = auVar8._12_4_ - auVar8._4_4_;
    iVar6 = iVar5 * 3 + 3;
    iVar5 = iVar5 * 3 + 6;
    if (-1 < iVar6) {
      iVar5 = iVar6;
    }
    iVar6 = iVar5 >> 2;
    if (0x2cf < iVar5 >> 2) {
      iVar6 = 0x2d0;
    }
    lVar7 = (long)auVar8._8_4_ + (long)auVar8._0_4_;
    lVar4 = (auVar8._8_8_ >> 0x20) + (auVar8._0_8_ >> 0x20);
    local_520[0]._0_4_ =
         (int)((ulong)(lVar7 - (lVar7 >> 0x3f)) >> 1) - ((iVar3 - (iVar3 + -1 >> 0x1f)) + -1 >> 1);
    local_520[0]._4_4_ =
         (int)((ulong)(lVar4 - (lVar4 >> 0x3f)) >> 1) - ((iVar6 - (iVar6 + -1 >> 0x1f)) + -1 >> 1);
    local_520[0]._8_4_ = iVar3 + local_520[0]._0_4_ + -1;
    local_520[0]._12_4_ = local_520[0]._4_4_ + -1 + iVar6;
    QWidget::setGeometry((QRect *)this);
  }
  local_578._0_8_ = (PrivateShared *)0x0;
  local_578._8_8_ = 0;
  local_578._16_8_ = 0;
  local_560 = 2;
  QSettings::value((QString *)local_520,(QVariant *)local_540);
  QVariant::toByteArray();
  QVariant::~QVariant((QVariant *)local_520);
  QVariant::~QVariant((QVariant *)local_578);
  if (local_548 != 0) {
    QMainWindow::addToolBar((QToolBar *)this);
    QMainWindow::addToolBar((QToolBar *)this);
    QMainWindow::addToolBar((QToolBar *)this);
    QMainWindow::addToolBar((QToolBar *)this);
    QMainWindow::addToolBar((QToolBar *)this);
    cVar2 = QMainWindow::restoreState((QByteArray *)this,(int)local_558);
    if (cVar2 != '\0') goto LAB_0015e19c;
  }
  initState(this);
LAB_0015e19c:
  pQVar1 = this->mVSplitter;
  local_578._0_8_ = (PrivateShared *)0x0;
  local_578._8_8_ = 0;
  local_578._16_8_ = 0;
  local_560 = 2;
  QSettings::value((QString *)local_520,(QVariant *)local_540);
  QVariant::toByteArray();
  cVar2 = QSplitter::restoreState((QByteArray *)pQVar1);
  if (cVar2 == '\0') {
    rationSplitter(pQVar1,0.625);
  }
  if (&(local_598.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_598.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_598.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_598.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_598.d.d)->super_QArrayData,1,8);
    }
  }
  QVariant::~QVariant((QVariant *)local_520);
  QVariant::~QVariant((QVariant *)local_578);
  pQVar1 = this->mHSplitter;
  local_578._0_8_ = (PrivateShared *)0x0;
  local_578._8_8_ = 0;
  local_578._16_8_ = 0;
  local_560 = 2;
  QSettings::value((QString *)local_520,(QVariant *)local_540);
  QVariant::toByteArray();
  cVar2 = QSplitter::restoreState((QByteArray *)pQVar1);
  if (cVar2 == '\0') {
    rationSplitter(pQVar1,0.625);
  }
  if (&(local_598.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_598.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_598.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_598.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_598.d.d)->super_QArrayData,1,8);
    }
  }
  QVariant::~QVariant((QVariant *)local_520);
  QVariant::~QVariant((QVariant *)local_578);
  ModuleFile::setName(&this->mModuleFile,(QString *)local_540._16_8_);
  updateWindowTitle(this);
  Config::Config((Config *)local_520);
  Config::readSettings((Config *)local_520,this_00,this_01);
  applyConfig(this,(Config *)local_520,(Categories)0x1f,(QString *)0x0);
  Config::writeSettings((Config *)local_520,this_00,this_01);
  QWidget::setAcceptDrops(SUB81(this,0));
  local_578._0_8_ = (QArrayData *)0x0;
  local_578._8_8_ = L"\nQToolBar QLabel {\n    padding-left: 3px;\n    padding-right: 3px;\n}\n    "
  ;
  local_578._16_8_ = 0x48;
  QWidget::setStyleSheet((QString *)this);
  if ((QArrayData *)local_578._0_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_578._0_8_ = *(int *)local_578._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_578._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_578._0_8_,2,8);
    }
  }
  Config::~Config((Config *)local_520);
  if (local_558[0] != (QArrayData *)0x0) {
    LOCK();
    (local_558[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_558[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_558[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_558[0],1,8);
    }
  }
  QSettings::~QSettings((QSettings *)local_540);
  return;
}

Assistant:

MainWindow::MainWindow() :
    QMainWindow(),
    mAudioEnumerator(),
    mUntitledString(tr("Untitled")),
    mPianoInput(),
    mMidi(),
    mModule(),
    mModuleFile(),
    mErrorSinceLastConfig(false),
    mLastEngineFrame(),
    mFrameSkip(0),
    mAutosave(false),
    mAutosaveIntervalMs(30000),
    mAudioDiag(nullptr),
    mTempoCalc(nullptr),
    mCommentsDialog(nullptr),
    mInstrumentEditor(nullptr),
    mWaveEditor(nullptr),
    mHistoryDialog(nullptr),
    mEffectsListDialog(nullptr)
{

    // create models
    mModule = new Module(this);
    mInstrumentModel = new InstrumentListModel(*mModule, this);
    mSongListModel = new SongListModel(*mModule, this);
    mSongModel = new SongModel(*mModule, this);
    mPatternModel = new PatternModel(*mModule, *mSongModel, this);
    mWaveModel = new WaveListModel(*mModule, this);

    mRenderer = new Renderer(*mModule, this);

    setupUi();

    // read in application configuration
    //mConfig.readSettings(mAudioEnumerator, mMidiEnumerator);
    
    setWindowIcon(IconLocator::getAppIcon());

    QSettings settings;
    settings.beginGroup(TU::KEY_MAIN_WINDOW);

    // restore geomtry from the last session
    if (!restoreGeometry(settings.value(TU::KEY_GEOMETRY, QByteArray()).toByteArray())) {
        // no saved geometry, initialize it
        // we will take 3/4 of the primary screen's width and height, but we
        // will take no more than 1280x720

        // maximum initial resolution
        constexpr int MAX_WIDTH = 1280;
        constexpr int MAX_HEIGHT = 720;

        // get the available geometry for the primary screen
        auto const availableGeometry = QApplication::primaryScreen()->availableGeometry();

        QRect newGeometry(
            0,
            0, 
            std::min(MAX_WIDTH, availableGeometry.width() * 3 / 4),
            std::min(MAX_HEIGHT, availableGeometry.height() * 3 / 4)
        );

        newGeometry.moveTo(availableGeometry.center() - newGeometry.center());
        setGeometry(newGeometry);
    }

    // restore window state if it exists
    auto const windowState = settings.value(TU::KEY_WINDOW_STATE).toByteArray();
    if (windowState.isEmpty()) {
        // default layout
        initState();
    } else {
        addToolBar(mToolbarFile);
        addToolBar(mToolbarEdit);
        addToolBar(mToolbarSong);
        addToolBar(mToolbarTracker);
        addToolBar(mToolbarInput);
        if (!restoreState(windowState, TU::WINDOW_STATE_VERSION)) {
            initState();
        }
    }

    // restore splitter sizes
    auto restoreSplitter = [](QSplitter &splitter, QByteArray const& state, float defaultRatio) {
        if (!splitter.restoreState(state)) {
            rationSplitter(splitter, defaultRatio);
        }
    };
    restoreSplitter(*mVSplitter, settings.value(TU::KEY_VSPLITTER).toByteArray(), TU::DEFAULT_VSPLITTER_RATIO);
    restoreSplitter(*mHSplitter, settings.value(TU::KEY_HSPLITTER).toByteArray(), TU::DEFAULT_HSPLITTER_RATIO);

    mModuleFile.setName(mUntitledString);
    updateWindowTitle();

    // apply the read in configuration
    Config config;
    config.readSettings(mAudioEnumerator, mMidiEnumerator);
    applyConfig(config, Config::CategoryAll);
    config.writeSettings(mAudioEnumerator, mMidiEnumerator);

    setAcceptDrops(true);

    setStyleSheet(QStringLiteral(R"stylesheet(
QToolBar QLabel {
    padding-left: 3px;
    padding-right: 3px;
}
    )stylesheet"));
}